

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

bool __thiscall create::Create::isVirtualWall(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  Packet *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'\r');
  if (bVar1) {
    Data::getPacket((Data *)&local_18,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar2 = Packet::getData(local_18);
    bVar1 = uVar2 != 0;
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Create] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Virtual Wall sensor not supported!",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Create::isVirtualWall() const {
    if (data->isValidPacketID(ID_VIRTUAL_WALL)) {
      return GET_DATA(ID_VIRTUAL_WALL);
    }
    else {
      CERR("[create::Create] ", "Virtual Wall sensor not supported!");
      return false;
    }
  }